

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi.c
# Opt level: O3

void do_bidi_new(BidiContext *ctx,bidi_char *text,size_t textlen)

{
  long *plVar1;
  byte *pbVar2;
  undefined4 uVar3;
  BidiType *pBVar4;
  size_t sVar5;
  size_t *psVar6;
  bidi_char *pbVar7;
  undefined8 uVar8;
  undefined1 auVar9 [15];
  undefined1 auVar10 [14];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [14];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  unkuint9 Var18;
  undefined1 auVar19 [11];
  undefined1 auVar20 [13];
  undefined1 auVar21 [14];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  bool bVar24;
  int iVar25;
  BidiType BVar26;
  BidiType BVar27;
  uint uVar28;
  uchar uVar29;
  size_t c;
  BidiType *pBVar30;
  uchar *puVar31;
  size_t *psVar32;
  _Bool *p_Var33;
  ulong uVar34;
  size_t sVar35;
  IsolatingRunSequence *pIVar36;
  size_t sVar37;
  size_t sVar38;
  byte bVar39;
  BidiType BVar40;
  size_t *psVar41;
  ulong uVar42;
  DirectionalOverride DVar43;
  size_t sVar44;
  size_t *psVar45;
  long lVar46;
  BidiType BVar47;
  ulong uVar48;
  byte bVar49;
  uint uVar50;
  long lVar51;
  int iVar52;
  BidiType BVar53;
  size_t sVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  int iVar58;
  ulong uVar59;
  size_t c2;
  size_t sVar60;
  bidi_char **ppbVar61;
  ulong uVar62;
  uint counter;
  int iVar63;
  bool bVar64;
  ushort uVar65;
  undefined1 auVar66 [15];
  undefined1 auVar67 [16];
  size_t *local_90;
  size_t local_78;
  
  if (ctx->internal_array_sizes < textlen) {
    ctx->internal_array_sizes = textlen;
    pBVar30 = (BidiType *)saferealloc(ctx->types,textlen,4);
    ctx->types = pBVar30;
    pBVar30 = (BidiType *)saferealloc(ctx->origTypes,ctx->internal_array_sizes,4);
    ctx->origTypes = pBVar30;
    puVar31 = (uchar *)saferealloc(ctx->levels,ctx->internal_array_sizes,1);
    ctx->levels = puVar31;
    psVar32 = (size_t *)saferealloc(ctx->irsindices,ctx->internal_array_sizes,8);
    ctx->irsindices = psVar32;
    p_Var33 = (_Bool *)saferealloc(ctx->irsdone,ctx->internal_array_sizes,1);
    ctx->irsdone = p_Var33;
    psVar32 = (size_t *)saferealloc(ctx->bracketpos,ctx->internal_array_sizes,8);
    ctx->bracketpos = psVar32;
    ctx->text = text;
    ctx->textlen = textlen;
  }
  else {
    ctx->text = text;
    ctx->textlen = textlen;
    if (textlen == 0) {
      bVar64 = true;
      goto LAB_00101727;
    }
  }
  pBVar30 = ctx->types;
  pBVar4 = ctx->origTypes;
  sVar44 = 0;
  do {
    iVar63 = -1;
    iVar52 = 0x510;
    do {
      iVar58 = (iVar63 + iVar52) / 2;
      iVar25 = iVar58;
      if ((bidi_getType::lookup[iVar58].first <= (int)text[sVar44].wc) &&
         (iVar25 = iVar52, iVar63 = iVar58,
         (int)text[sVar44].wc <= bidi_getType::lookup[iVar58].last)) {
        BVar40 = (BidiType)(byte)bidi_getType::lookup[iVar58].type;
        goto LAB_001016f0;
      }
      iVar52 = iVar25;
    } while (1 < iVar52 - iVar63);
    BVar40 = ON;
LAB_001016f0:
    pBVar4[sVar44] = BVar40;
    pBVar30[sVar44] = BVar40;
    sVar44 = sVar44 + 1;
  } while (sVar44 != textlen);
  sVar44 = 0;
  do {
    if ((0x83f6U >> (pBVar30[sVar44] & (CS|AN)) & 1) != 0) {
      BVar40 = ctx->paragraphOverride;
      bVar64 = false;
      goto LAB_0010173c;
    }
    sVar44 = sVar44 + 1;
  } while (textlen != sVar44);
  bVar64 = false;
LAB_00101727:
  BVar40 = ctx->paragraphOverride;
  if ((0x83f6U >> (BVar40 & (CS|AN)) & 1) == 0) {
    return;
  }
LAB_0010173c:
  local_90 = &ctx->textlen;
  ppbVar61 = &ctx->text;
  if (BVar40 == L) {
    uVar29 = '\0';
  }
  else if (BVar40 == R) {
    uVar29 = '\x01';
  }
  else {
    uVar29 = rule_p2_p3(ctx->types,textlen);
  }
  ctx->paragraphLevel = uVar29;
  ctx->ds_sp = 0;
  ctx->dsstack[0].level = uVar29;
  ctx->dsstack[0].override = DO_NEUTRAL;
  ctx->dsstack[0].isolate = false;
  ctx->overflowIsolateCount = 0;
  ctx->overflowEmbeddingCount = 0;
  ctx->validIsolateCount = 0;
  if (bVar64) {
    textlen = *local_90;
  }
  else {
    psVar32 = &ctx->ds_sp;
    psVar45 = &ctx->overflowIsolateCount;
    psVar6 = &ctx->overflowEmbeddingCount;
    uVar34 = 0;
    do {
      pBVar30 = ctx->types;
      BVar40 = pBVar30[uVar34];
      switch(BVar40 - LRE) {
      case L:
      case LRE:
      case AL:
      case RLE:
        ctx->levels[uVar34] = ctx->dsstack[ctx->ds_sp].level;
        switch(BVar40 - LRE) {
        case L:
          sVar44 = ctx->ds_sp;
          bVar49 = (ctx->dsstack[sVar44].level | 1) + 1;
          goto LAB_00101a4c;
        case LRE:
          sVar44 = ctx->ds_sp;
          bVar49 = (ctx->dsstack[sVar44].level | 1) + 1;
          DVar43 = DO_LTR;
          break;
        default:
          __assert_fail("false && \"how did this get past the outer switch?\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/bidi.c"
                        ,0xa95,"void process_explicit_embeddings(BidiContext *)");
        case AL:
          sVar44 = ctx->ds_sp;
          bVar49 = ctx->dsstack[sVar44].level + 1 | 1;
LAB_00101a4c:
          DVar43 = DO_NEUTRAL;
          break;
        case RLE:
          sVar44 = ctx->ds_sp;
          bVar49 = ctx->dsstack[sVar44].level + 1 | 1;
          DVar43 = DO_RTL;
        }
        if (bVar49 < 0x7e) {
          if (*psVar45 == 0) {
            sVar35 = *psVar6;
            if (sVar35 != 0) goto LAB_00101abc;
            *psVar32 = sVar44 + 1;
            if (0x7e < sVar44 + 1) goto LAB_0010282e;
            ctx->dsstack[sVar44 + 1].level = bVar49;
            ctx->dsstack[sVar44 + 1].override = DVar43;
            ctx->dsstack[sVar44 + 1].isolate = false;
          }
        }
        else if (*psVar45 == 0) {
          sVar35 = *psVar6;
LAB_00101abc:
          *psVar6 = sVar35 + 1;
        }
        break;
      default:
        sVar44 = ctx->ds_sp;
        goto LAB_00101a05;
      case RLI:
        if ((*psVar45 == 0) &&
           ((sVar44 = *psVar6, psVar41 = psVar6, sVar44 != 0 ||
            ((sVar44 = *psVar32, sVar44 != 0 &&
             (psVar41 = psVar32, ctx->dsstack[sVar44].isolate == false)))))) {
          *psVar41 = sVar44 - 1;
        }
        uVar29 = ctx->dsstack[ctx->ds_sp].level;
        puVar31 = ctx->levels;
        goto LAB_001019f1;
      case PDF:
        if (*psVar45 == 0) {
          sVar44 = ctx->ds_sp;
          if (ctx->validIsolateCount != 0) {
            ctx->overflowEmbeddingCount = 0;
            sVar35 = sVar44;
            if (ctx->dsstack[sVar44].isolate == false) {
              do {
                sVar44 = sVar35 - 1;
                if (sVar35 == 0) goto LAB_001027d1;
                ctx->ds_sp = sVar44;
                lVar46 = sVar35 - 1;
                sVar35 = sVar44;
              } while (ctx->dsstack[lVar46].isolate != true);
            }
            if (sVar44 == 0) {
LAB_001027d1:
              __assert_fail("ctx->ds_sp > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/bidi.c"
                            ,0xa66,"void pop(BidiContext *)");
            }
            sVar44 = sVar44 - 1;
            ctx->ds_sp = sVar44;
            ctx->validIsolateCount = ctx->validIsolateCount - 1;
          }
        }
        else {
          *psVar45 = *psVar45 - 1;
          sVar44 = *psVar32;
        }
LAB_00101a05:
        ctx->levels[uVar34] = ctx->dsstack[sVar44].level;
        DVar43 = ctx->dsstack[ctx->ds_sp].override;
        if (DVar43 != DO_NEUTRAL) {
          ctx->types[uVar34] = (uint)(DVar43 != DO_LTR) << 2;
        }
        break;
      case PDI:
        uVar62 = uVar34 + 1;
        uVar57 = textlen;
        if (uVar62 < textlen) {
          iVar63 = 1;
          uVar42 = uVar62;
          do {
            if ((0x908U >> (pBVar30[uVar42] & (CS|AN)) & 1) == 0) {
              if ((pBVar30[uVar42] == PDI) && (iVar63 = iVar63 + -1, uVar57 = uVar42, iVar63 == 0))
              break;
            }
            else {
              iVar63 = iVar63 + 1;
            }
            uVar42 = uVar42 + 1;
            uVar57 = textlen;
          } while (textlen != uVar42);
        }
        uVar29 = rule_p2_p3(pBVar30 + uVar62,uVar57 - uVar62);
        BVar40 = (uint)(uVar29 == '\x01') * 5 + LRI;
      case LRO:
      case RLO:
        ctx->levels[uVar34] = ctx->dsstack[ctx->ds_sp].level;
        sVar44 = ctx->ds_sp;
        DVar43 = ctx->dsstack[sVar44].override;
        if (DVar43 != DO_NEUTRAL) {
          BVar47 = L;
          if ((DVar43 != DO_LTR) && (BVar47 = BVar40, DVar43 == DO_RTL)) {
            BVar47 = R;
          }
          ctx->types[uVar34] = BVar47;
        }
        bVar49 = ctx->dsstack[sVar44].level;
        bVar39 = (bVar49 | 1) + 1;
        if (BVar40 == RLI) {
          bVar39 = bVar49 + 1 | 1;
        }
        if ((ctx->overflowIsolateCount == 0 && bVar39 < 0x7e) && (*psVar6 == 0)) {
          *psVar32 = sVar44 + 1;
          if (0x7e < sVar44 + 1) {
LAB_0010282e:
            __assert_fail("ctx->ds_sp < lenof(ctx->dsstack)",
                          "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/bidi.c"
                          ,0xa5e,
                          "void push(BidiContext *, unsigned char, DirectionalOverride, _Bool)");
          }
          ctx->dsstack[sVar44 + 1].level = bVar39;
          ctx->dsstack[sVar44 + 1].override = DO_NEUTRAL;
          ctx->dsstack[sVar44 + 1].isolate = true;
          ctx->validIsolateCount = ctx->validIsolateCount + 1;
        }
        else {
          *psVar45 = ctx->overflowIsolateCount + 1;
        }
        break;
      case NSM:
        uVar29 = ctx->dsstack[ctx->ds_sp].level;
        goto LAB_001018c5;
      case BN:
        if (uVar34 != textlen - 1) {
          __assert_fail("i == ctx->textlen - 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/bidi.c"
                        ,0xaf5,"void process_explicit_embeddings(BidiContext *)");
        }
        uVar29 = ctx->paragraphLevel;
LAB_001018c5:
        puVar31 = ctx->levels;
LAB_001019f1:
        puVar31[uVar34] = uVar29;
      }
      uVar34 = uVar34 + 1;
      textlen = *local_90;
    } while (uVar34 < textlen);
  }
  if (textlen == 0) {
    textlen = 0;
  }
  else {
    uVar34 = 0;
    do {
      pBVar30 = ctx->types;
      if ((((0x402c6U >> (pBVar30[uVar34] & (CS|AN)) & 1) != 0) &&
          (pBVar30[uVar34] = BN, uVar34 != 0)) && (pBVar30[uVar34 - 1] == BN)) {
        ctx->levels[uVar34] = ctx->levels[uVar34 - 1];
        textlen = ctx->textlen;
      }
      uVar34 = uVar34 + 1;
    } while (uVar34 < textlen);
  }
  memset(ctx->irsdone,0,textlen);
  uVar34 = ctx->textlen;
  if (uVar34 == 0) {
    ctx->irslen = 0;
    return;
  }
  uVar62 = 0;
  local_78 = 0;
  sVar44 = 0;
LAB_00101bde:
  while (ctx->irsdone[uVar62] == true) {
    uVar62 = uVar62 + 1;
    if (uVar34 <= uVar62) goto LAB_00101df6;
  }
  pIVar36 = (IsolatingRunSequence *)
            safegrowarray(ctx->irslist,&ctx->irslistsize,0x20,local_78,1,false);
  ctx->irslist = pIVar36;
  pIVar36[local_78].start = sVar44;
  puVar31 = ctx->levels;
  uVar34 = ctx->textlen;
  uVar29 = puVar31[uVar62];
  uVar57 = uVar62;
  if (uVar62 < uVar34) {
LAB_00101c5a:
    sVar35 = sVar44;
    if (puVar31[uVar57] != uVar29) {
      __assert_fail("ctx->levels[j] == irslevel",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/terminal/bidi.c"
                    ,0xb90,"void find_isolating_run_sequences(BidiContext *, irs_fn_t)");
    }
    psVar32 = ctx->irsindices;
    p_Var33 = ctx->irsdone;
    lVar46 = 0;
    do {
      lVar51 = lVar46;
      p_Var33[lVar51 + uVar57] = true;
      psVar32[sVar35 + lVar51] = uVar57 + lVar51;
      uVar34 = *local_90;
      if (uVar34 <= lVar51 + uVar57 + 1) goto LAB_00101d0d;
      lVar46 = lVar51 + 1;
    } while (puVar31[lVar51 + uVar57 + 1] == uVar29);
    if ((0x908U >> (ctx->types[uVar57 + lVar51] & (CS|AN)) & 1) != 0) {
      uVar57 = uVar57 + lVar46;
      iVar63 = 1;
      do {
        BVar40 = ctx->types[uVar57];
        if ((0x908U >> (BVar40 & (CS|AN)) & 1) == 0) {
          if ((BVar40 == PDI) && (iVar63 = iVar63 + -1, iVar63 == 0)) goto LAB_00101d04;
        }
        else {
          iVar63 = iVar63 + 1;
        }
        uVar57 = uVar57 + 1;
        if (uVar34 == uVar57) break;
      } while( true );
    }
    goto LAB_00101d0d;
  }
  goto LAB_00101d20;
LAB_00101d04:
  sVar44 = sVar35 + lVar46;
  if (uVar34 <= uVar57) goto LAB_00101d0d;
  goto LAB_00101c5a;
LAB_00101d0d:
  sVar44 = sVar35 + lVar51 + 1;
LAB_00101d20:
  sVar35 = local_78 + 1;
  pIVar36[local_78].end = sVar44;
  bVar49 = ctx->paragraphLevel;
  uVar57 = uVar62;
  do {
    bVar64 = uVar57 == 0;
    uVar57 = uVar57 - 1;
    if (bVar64) {
      pBVar30 = ctx->types;
      bVar39 = bVar49;
      goto LAB_00101d60;
    }
    pBVar30 = ctx->types;
  } while (pBVar30[uVar57] == BN);
  bVar39 = puVar31[uVar57];
LAB_00101d60:
  if (bVar39 < puVar31[uVar62]) {
    bVar39 = puVar31[uVar62];
  }
  pIVar36[local_78].sos = (uint)(byte)((bVar39 & 1) << 2);
  sVar60 = ctx->irsindices[sVar44 - 1];
  pbVar2 = puVar31 + sVar60;
  if ((0x908U >> (pBVar30[sVar60] & (CS|AN)) & 1) == 0) {
    do {
      sVar60 = sVar60 + 1;
      if (uVar34 <= sVar60) goto LAB_00101db1;
    } while (pBVar30[sVar60] == BN);
    bVar49 = puVar31[sVar60];
  }
LAB_00101db1:
  if (bVar49 < *pbVar2) {
    bVar49 = *pbVar2;
  }
  auVar67 = psllw(ZEXT216(CONCAT11(uVar29,bVar49)),2);
  auVar66 = auVar67._0_15_ & DAT_00108950._0_15_;
  auVar9[0xd] = 0;
  auVar9._0_13_ = auVar66._0_13_;
  auVar9[0xe] = auVar66[7];
  auVar11[0xc] = auVar66[6];
  auVar11._0_12_ = auVar66._0_12_;
  auVar11._13_2_ = auVar9._13_2_;
  auVar12[0xb] = 0;
  auVar12._0_11_ = auVar66._0_11_;
  auVar12._12_3_ = auVar11._12_3_;
  auVar13[10] = auVar66[5];
  auVar13._0_10_ = auVar66._0_10_;
  auVar13._11_4_ = auVar12._11_4_;
  auVar14[9] = 0;
  auVar14._0_9_ = auVar66._0_9_;
  auVar14._10_5_ = auVar13._10_5_;
  auVar16[8] = auVar66[4];
  auVar16._0_8_ = auVar66._0_8_;
  auVar16._9_6_ = auVar14._9_6_;
  auVar17._7_8_ = 0;
  auVar17._0_7_ = auVar16._8_7_;
  Var18 = CONCAT81(SUB158(auVar17 << 0x40,7),auVar66[3]);
  auVar22._9_6_ = 0;
  auVar22._0_9_ = Var18;
  auVar19._1_10_ = SUB1510(auVar22 << 0x30,5);
  auVar19[0] = auVar66[2];
  auVar23._11_4_ = 0;
  auVar23._0_11_ = auVar19;
  auVar20._1_12_ = SUB1512(auVar23 << 0x20,3);
  auVar20[0] = auVar66[1];
  uVar65 = CONCAT11(0,auVar66[0]);
  auVar66._2_13_ = auVar20;
  auVar66._0_2_ = uVar65;
  auVar10._10_2_ = 0;
  auVar10._0_10_ = auVar66._0_10_;
  auVar10._12_2_ = (short)Var18;
  auVar21._2_4_ = auVar10._10_4_;
  auVar21._0_2_ = auVar19._0_2_;
  auVar21._6_8_ = 0;
  auVar15._6_8_ = SUB148(auVar21 << 0x40,6);
  auVar15._4_2_ = auVar20._0_2_;
  auVar15._2_2_ = 0;
  auVar15._0_2_ = uVar65;
  pIVar36[local_78].eos = (int)auVar15._0_8_;
  pIVar36[local_78].embeddingDirection = (int)((ulong)auVar15._0_8_ >> 0x20);
  local_78 = sVar35;
  if (uVar34 <= uVar62) goto LAB_00101df6;
  goto LAB_00101bde;
  while( true ) {
    plVar1 = (long *)(psVar41 + -3);
    psVar41 = psVar41 + -2;
    if (((int)*plVar1 == (int)*(undefined8 *)(bracket_type_bracket_pairs + lVar46 + 4)) ||
       ((int)*plVar1 ==
        (int)((ulong)*(undefined8 *)(bracket_type_bracket_pairs + lVar46 + 4) >> 0x20))) break;
LAB_00102205:
    bVar64 = uVar57 == 0;
    uVar57 = uVar57 - 1;
    if (bVar64) goto LAB_001021ce;
  }
  psVar6[*psVar41] = sVar60;
  uVar62 = ctx->irslen;
  uVar34 = uVar57;
LAB_001021ce:
  sVar60 = sVar60 + 1;
  if (uVar62 <= sVar60) goto LAB_00102261;
  goto LAB_0010216f;
LAB_00102261:
  if (uVar62 == 0) {
LAB_0010240b:
    uVar62 = 0;
  }
  else {
    uVar34 = 0;
    do {
      uVar57 = psVar6[uVar34];
      if ((uVar57 != 0xffffffffffffffff) &&
         (sVar60 = psVar45[uVar34], (0x780000U >> (pBVar30[sVar60] & (CS|AN)) & 1) != 0)) {
        sVar37 = psVar45[uVar57];
        if (uVar34 + 1 < uVar57 && (0x780000U >> (pBVar30[sVar37] & (CS|AN)) & 1) != 0) {
          bVar64 = false;
          uVar42 = uVar34 + 1;
          do {
            while( true ) {
              uVar55 = uVar42 + 1;
              BVar40 = pBVar30[psVar45[uVar42]];
              uVar56 = uVar34;
              uVar48 = uVar34;
              uVar42 = uVar55;
              if ((0x9031U >> (BVar40 & (CS|AN)) & 1) != 0) break;
              if (uVar55 == uVar57) {
                if (!bVar64) goto LAB_00102335;
                goto LAB_0010235e;
              }
            }
            BVar47 = (uint)(BVar40 != L) << 2;
            if ((uint)(BVar40 != L) << 2 == ctx->embeddingDirection) goto LAB_001023a6;
            bVar64 = true;
          } while (uVar55 != uVar57);
LAB_0010235e:
          do {
            if (uVar48 == 0) {
              BVar47 = ctx->sos;
              if (BVar47 != ON) goto LAB_001023a6;
              goto LAB_00102335;
            }
            lVar46 = uVar48 - 1;
            uVar48 = uVar48 - 1;
          } while ((0x9031U >> (pBVar30[psVar32[sVar35 + lVar46]] & (CS|AN)) & 1) == 0);
          BVar47 = (uint)(pBVar30[psVar32[sVar35 + lVar46]] != L) << 2;
LAB_001023a6:
          do {
            pBVar30[sVar60] = BVar47;
            do {
              uVar42 = uVar56 + 1;
              if (uVar62 <= uVar42) goto LAB_001023d7;
              sVar60 = psVar32[sVar35 + uVar56 + 1];
              uVar56 = uVar42;
            } while (ctx->origTypes[sVar60] == BN);
          } while (ctx->origTypes[sVar60] == NSM);
LAB_001023d7:
          do {
            pBVar30[sVar37] = BVar47;
            uVar42 = uVar57;
            do {
              uVar57 = uVar42 + 1;
              if (uVar62 <= uVar57) goto LAB_00102335;
              sVar37 = psVar32[sVar35 + uVar42 + 1];
              uVar42 = uVar57;
            } while (ctx->origTypes[sVar37] == BN);
          } while (ctx->origTypes[sVar37] == NSM);
        }
      }
LAB_00102335:
      uVar34 = uVar34 + 1;
    } while (uVar34 < uVar62);
  }
  BVar40 = ctx->sos;
  uVar57 = 0;
  uVar34 = 0xffffffffffffffff;
  do {
    pBVar30 = &ctx->eos;
    if (uVar57 < uVar62) {
      pBVar30 = ctx->types + psVar45[uVar57];
    }
    BVar47 = *pBVar30;
    if ((0x9031U >> (BVar47 & (CS|AN)) & 1) == 0) {
      uVar42 = uVar34;
      if (uVar34 == 0xffffffffffffffff) {
        uVar42 = uVar57;
      }
      BVar53 = BVar40;
      if ((1 << ((byte)BVar47 & 0x1f) & 0x700d08U) == 0) {
        uVar42 = uVar34;
      }
    }
    else {
      BVar53 = (uint)(BVar47 != L) << 2;
      uVar42 = 0xffffffffffffffff;
      if (uVar34 != 0xffffffffffffffff) {
        if (BVar53 != BVar40) {
          BVar40 = ctx->embeddingDirection;
        }
        if (uVar34 < uVar57) {
          pBVar30 = ctx->types;
          do {
            if ((0x700d08U >> (pBVar30[psVar45[uVar34]] & (CS|AN)) & 1) != 0) {
              pBVar30[psVar45[uVar34]] = BVar40;
            }
            uVar34 = uVar34 + 1;
          } while (uVar34 < uVar57);
        }
      }
    }
    BVar40 = BVar53;
    uVar57 = uVar57 + 1;
    uVar34 = uVar42;
  } while (uVar57 != uVar62 + 1 + (ulong)(uVar62 == 0xffffffffffffffff));
  if (uVar62 != 0) {
    uVar34 = 0;
    do {
      sVar35 = ctx->irs[uVar34];
      bVar49 = ctx->levels[sVar35];
      BVar40 = ctx->types[sVar35];
      if ((bVar49 & 1) == 0) {
        if ((BVar40 == AN) || (BVar40 == EN)) {
          bVar49 = bVar49 + 2;
        }
        else {
          if (BVar40 != R) goto LAB_00102546;
          bVar49 = bVar49 | 1;
        }
LAB_0010253b:
        ctx->levels[sVar35] = bVar49;
        uVar62 = ctx->irslen;
      }
      else if ((BVar40 < CS) && ((0x9001U >> (BVar40 & (CS|AN)) & 1) != 0)) {
        bVar49 = bVar49 + 1;
        goto LAB_0010253b;
      }
LAB_00102546:
      uVar34 = uVar34 + 1;
    } while (uVar34 < uVar62);
  }
  sVar44 = sVar44 + 1;
  if (sVar44 == local_78) goto code_r0x00102561;
  goto LAB_00101e39;
code_r0x00102561:
  uVar34 = *local_90;
  goto LAB_00102569;
LAB_00101df6:
  if (local_78 != 0) {
    sVar44 = 0;
LAB_00101e39:
    psVar32 = ctx->irsindices;
    pIVar36 = ctx->irslist;
    sVar35 = pIVar36[sVar44].start;
    psVar45 = psVar32 + sVar35;
    ctx->irs = psVar45;
    sVar60 = pIVar36[sVar44].end;
    ctx->irslen = sVar60 - sVar35;
    uVar34._0_4_ = pIVar36[sVar44].sos;
    uVar34._4_4_ = pIVar36[sVar44].eos;
    ctx->sos = (undefined4)uVar34;
    ctx->eos = uVar34._4_4_;
    ctx->embeddingDirection = pIVar36[sVar44].embeddingDirection;
    if (sVar60 - sVar35 != 0) {
      pBVar30 = ctx->types;
      uVar34 = uVar34 & 0xffffffff;
      sVar37 = sVar35;
      do {
        BVar40 = pBVar30[psVar32[sVar37]];
        BVar47 = (BidiType)uVar34;
        if (BVar40 == NSM) {
          pBVar30[psVar32[sVar37]] = BVar47;
LAB_00101ecd:
          uVar34 = (ulong)BVar47;
        }
        else {
          uVar34 = 0x16;
          if ((0xd08U >> (BVar40 & (CS|AN)) & 1) == 0) {
            if (BVar40 != BN) {
              BVar47 = BVar40;
            }
            goto LAB_00101ecd;
          }
        }
        sVar37 = sVar37 + 1;
      } while (sVar60 != sVar37);
      BVar40 = ctx->sos;
      sVar37 = sVar35;
      do {
        BVar47 = pBVar30[psVar32[sVar37]];
        if ((BVar47 == EN) && (BVar40 == AL)) {
          pBVar30[psVar32[sVar37]] = AN;
          BVar40 = AL;
        }
        else if ((0x31U >> (BVar47 & (CS|AN)) & 1) != 0) {
          BVar40 = BVar47;
        }
        sVar37 = sVar37 + 1;
        sVar38 = sVar35;
      } while (sVar60 != sVar37);
      do {
        if (pBVar30[psVar32[sVar38]] == AL) {
          pBVar30[psVar32[sVar38]] = R;
        }
        sVar38 = sVar38 + 1;
      } while (sVar60 != sVar38);
      BVar47 = ON;
      BVar40 = ON;
      sVar37 = sVar35;
      sVar38 = 0;
      do {
        sVar5 = psVar32[sVar37];
        BVar53 = pBVar30[sVar5];
        sVar54 = sVar38;
        BVar26 = BVar47;
        BVar27 = BVar40;
        if (((BVar53 != BN) && (sVar54 = sVar5, BVar26 = BVar53, BVar27 = BVar47, BVar40 == BVar53))
           && ((BVar26 = BVar40, BVar40 == EN && BVar47 == ES ||
               ((BVar47 == CS && ((BVar40 == AN || (BVar27 = CS, BVar40 == EN)))))))) {
          pBVar30[sVar38] = BVar40;
          BVar27 = BVar47;
        }
        BVar40 = BVar27;
        BVar47 = BVar26;
        sVar37 = sVar37 + 1;
        sVar38 = sVar54;
      } while (sVar60 != sVar37);
      sVar37 = sVar35;
      bVar64 = false;
      do {
        bVar24 = true;
        if (pBVar30[psVar32[sVar37]] != EN) {
          if ((bVar64) && ((0x44000U >> (pBVar30[psVar32[sVar37]] & (CS|AN)) & 1) != 0)) {
            pBVar30[psVar32[sVar37]] = EN;
            bVar24 = bVar64;
          }
          else {
            bVar24 = false;
          }
        }
        sVar37 = sVar37 + 1;
        sVar38 = sVar60;
        bVar64 = bVar24;
      } while (sVar60 != sVar37);
      do {
        bVar64 = true;
        if (pBVar30[psVar32[sVar38 - 1]] != EN) {
          if ((bVar24) && ((0x44000U >> (pBVar30[psVar32[sVar38 - 1]] & (CS|AN)) & 1) != 0)) {
            pBVar30[psVar32[sVar38 - 1]] = EN;
            bVar64 = bVar24;
          }
          else {
            bVar64 = false;
          }
        }
        bVar24 = bVar64;
        sVar38 = sVar38 - 1;
      } while (sVar35 != sVar38);
      sVar37 = sVar35;
      bVar49 = 0;
      do {
        bVar39 = 1;
        if ((0x16000U >> (pBVar30[psVar32[sVar37]] & (CS|AN)) & 1) == 0) {
          if ((bool)(pBVar30[psVar32[sVar37]] != BN | ~bVar49)) {
            bVar39 = 0;
          }
          else {
            pBVar30[psVar32[sVar37]] = CS;
            bVar39 = bVar49;
          }
        }
        sVar37 = sVar37 + 1;
        sVar38 = sVar60;
        bVar49 = bVar39;
      } while (sVar60 != sVar37);
      do {
        bVar49 = 1;
        if ((0x16000U >> (pBVar30[psVar32[sVar38 - 1]] & (CS|AN)) & 1) == 0) {
          if ((bool)(pBVar30[psVar32[sVar38 - 1]] != BN | ~bVar39 & 1)) {
            bVar49 = 0;
          }
          else {
            pBVar30[psVar32[sVar38 - 1]] = CS;
            bVar49 = bVar39;
          }
        }
        bVar39 = bVar49;
        sVar38 = sVar38 - 1;
        sVar37 = sVar35;
      } while (sVar35 != sVar38);
      do {
        if ((0x16000U >> (pBVar30[psVar32[sVar37]] & (CS|AN)) & 1) != 0) {
          pBVar30[psVar32[sVar37]] = ON;
        }
        sVar37 = sVar37 + 1;
      } while (sVar60 != sVar37);
      BVar40 = ctx->sos;
      sVar37 = sVar35;
      do {
        BVar47 = pBVar30[psVar32[sVar37]];
        if ((BVar47 == EN) && (BVar40 == L)) {
          pBVar30[psVar32[sVar37]] = L;
          BVar40 = L;
        }
        else if ((0x31U >> (BVar47 & (CS|AN)) & 1) != 0) {
          BVar40 = BVar47;
        }
        sVar37 = sVar37 + 1;
      } while (sVar60 != sVar37);
      psVar6 = ctx->bracketpos;
      uVar34 = 0;
      do {
        psVar6[uVar34] = 0xffffffffffffffff;
        uVar34 = uVar34 + 1;
        uVar62 = ctx->irslen;
      } while (uVar34 < uVar62);
      if (uVar62 != 0) {
        pbVar7 = *ppbVar61;
        uVar34 = 0;
        sVar60 = 0;
LAB_0010216f:
        uVar50 = pbVar7[psVar45[sVar60]].wc;
        iVar52 = 0x80;
        iVar63 = -1;
        do {
          iVar58 = (iVar52 + iVar63) / 2;
          lVar46 = (long)iVar58 * 0x10;
          iVar25 = iVar58;
          if ((*(uint *)(bracket_type_bracket_pairs + lVar46) <= uVar50) &&
             (iVar25 = iVar52, iVar63 = iVar58,
             uVar50 <= *(uint *)(bracket_type_bracket_pairs + lVar46))) {
            if (*(int *)(bracket_type_bracket_pairs + lVar46 + 0xc) == 1) {
              if (0x3e < uVar34) goto LAB_00102261;
              ctx->bstack[uVar34].ch = uVar50;
              ctx->bstack[uVar34].c = sVar60;
              uVar34 = uVar34 + 1;
            }
            else if (*(int *)(bracket_type_bracket_pairs + lVar46 + 0xc) == 2) {
              psVar41 = &ctx->bstack[uVar34].c;
              uVar57 = uVar34;
              goto LAB_00102205;
            }
            break;
          }
          iVar52 = iVar25;
        } while (1 < iVar52 - iVar63);
        goto LAB_001021ce;
      }
    }
    goto LAB_0010240b;
  }
LAB_00102569:
  ctx->irslen = 0;
  if (uVar34 != 0) {
    bVar64 = true;
    do {
      uVar50 = 1 << ((byte)ctx->origTypes[uVar34 - 1] & 0x1f);
      if ((0x180000U >> (ctx->origTypes[uVar34 - 1] & (CS|AN)) & 1) == 0) {
        if (bVar64) {
          if ((uVar50 & 0x200d08) != 0) goto LAB_001025a7;
          bVar64 = (uVar50 & 0x402c6) != 0;
        }
        else {
          bVar64 = false;
        }
      }
      else {
LAB_001025a7:
        ctx->levels[uVar34 - 1] = ctx->paragraphLevel;
        bVar64 = true;
      }
      uVar34 = uVar34 - 1;
    } while (uVar34 != 0);
    uVar34 = *local_90;
    if (uVar34 != 0) {
      uVar62 = 0;
      do {
        if ((0x402c6U >> (ctx->origTypes[uVar62] & (CS|AN)) & 1) != 0) {
          puVar31 = ctx->levels + (uVar62 - 1);
          if (uVar62 == 0) {
            puVar31 = &ctx->paragraphLevel;
          }
          (ctx->levels + (uVar62 - 1))[1] = *puVar31;
          uVar34 = ctx->textlen;
        }
        uVar62 = uVar62 + 1;
      } while (uVar62 < uVar34);
      if (uVar34 != 0) {
        puVar31 = ctx->levels;
        uVar62 = 0;
        do {
          if ((puVar31[uVar62] & 1) != 0) {
            uVar50 = (*ppbVar61)[uVar62].wc;
            iVar63 = -1;
            iVar52 = 0x1ac;
            do {
              iVar58 = (iVar63 + iVar52) / 2;
              iVar25 = iVar58;
              if ((*(uint *)(mirror_glyph_mirror_pairs + (long)iVar58 * 8) <= uVar50) &&
                 (iVar63 = iVar58, iVar25 = iVar52,
                 uVar50 <= *(uint *)(mirror_glyph_mirror_pairs + (long)iVar58 * 8))) {
                uVar50 = *(uint *)(mirror_glyph_mirror_pairs + (long)iVar58 * 8 + 4);
                break;
              }
              iVar52 = iVar25;
            } while (1 < iVar52 - iVar63);
            (*ppbVar61)[uVar62].wc = uVar50;
          }
          uVar62 = uVar62 + 1;
        } while (uVar62 != uVar34);
        uVar50 = 0;
        uVar62 = 0;
        do {
          bVar49 = puVar31[uVar62];
          uVar28 = (uint)bVar49;
          if (bVar49 < uVar50) {
            uVar28 = uVar50;
          }
          uVar50 = uVar28;
          uVar62 = uVar62 + 1;
          uVar57 = uVar34;
        } while (uVar34 != uVar62);
        for (; uVar50 != 0; uVar50 = uVar50 - 1) {
          if (uVar57 == 0) {
            uVar57 = 0;
          }
          else {
            uVar62 = 0;
            do {
              uVar42 = uVar62;
              if (uVar50 <= ctx->levels[uVar62]) {
                uVar48 = uVar62 + 1;
                uVar56 = uVar48;
                uVar55 = uVar48;
                if (uVar48 < uVar57) {
                  uVar55 = uVar57;
                }
                do {
                  uVar59 = uVar56;
                  uVar42 = uVar55;
                  if (uVar57 <= uVar59) break;
                  uVar56 = uVar59 + 1;
                  uVar42 = uVar59;
                } while (uVar50 <= ctx->levels[uVar59]);
                uVar42 = uVar42 - 1;
                if (uVar62 < uVar42) {
                  lVar46 = uVar42 * 0xc;
                  lVar51 = uVar62 * 0xc;
                  uVar34 = uVar42;
                  do {
                    pbVar7 = *ppbVar61;
                    uVar3 = *(undefined4 *)((long)&pbVar7->index + lVar51);
                    uVar8 = *(undefined8 *)((long)&pbVar7->origwc + lVar51);
                    *(undefined8 *)((long)&pbVar7->origwc + lVar51) =
                         *(undefined8 *)((long)&pbVar7->origwc + lVar46);
                    *(undefined4 *)((long)&pbVar7->index + lVar51) =
                         *(undefined4 *)((long)&pbVar7->index + lVar46);
                    pbVar7 = *ppbVar61;
                    *(undefined4 *)((long)&pbVar7->index + lVar46) = uVar3;
                    *(undefined8 *)((long)&pbVar7->origwc + lVar46) = uVar8;
                    uVar34 = uVar34 - 1;
                    lVar46 = lVar46 + -0xc;
                    lVar51 = lVar51 + 0xc;
                    bVar64 = uVar48 < uVar34;
                    uVar48 = uVar48 + 1;
                  } while (bVar64);
                  uVar34 = *local_90;
                }
              }
              uVar62 = uVar42 + 1;
              uVar57 = uVar34;
            } while (uVar62 < uVar34);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void do_bidi_new(BidiContext *ctx, bidi_char *text, size_t textlen)
{
    ensure_arrays(ctx, textlen);
    ctx->text = text;
    ctx->textlen = textlen;
    setup_types(ctx);

    /* Quick initial test: see if we need to bother with any work at all */
    if (!text_needs_bidi(ctx))
        return;

    set_paragraph_level(ctx);
    process_explicit_embeddings(ctx);
    remove_embedding_characters(ctx);
    find_isolating_run_sequences(ctx, process_isolating_run_sequence);

    /* If this implementation distinguished paragraphs from lines,
     * then this would be the point where we repeat the remainder of
     * the algorithm once for each line in the paragraph. */

    reset_whitespace_and_separators(ctx);
    mirror_glyphs(ctx);
    reverse_sequences(ctx);
}